

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simd_impl.h
# Opt level: O0

int simd_test_avx2::V64_V256_avx2_TestIntrinsics_Test::AddToRegistry(void)

{
  CodeLocation *this;
  ParameterizedTestSuiteInfo<simd_test_avx2::TestIntrinsic<std::tuple<unsigned_int,_unsigned_int,_const_char_*>_>_>
  *a_file;
  TestMetaFactory<simd_test_avx2::V64_V256_avx2_TestIntrinsics_Test> *this_00;
  ParameterizedTestSuiteRegistry *unaff_retaddr;
  undefined8 in_stack_ffffffffffffff30;
  int iVar1;
  string *in_stack_ffffffffffffff38;
  allocator local_a9;
  string local_a8 [72];
  CodeLocation *in_stack_ffffffffffffffa0;
  TestMetaFactoryBase<std::tuple<unsigned_int,_unsigned_int,_const_char_*>_>
  *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  ParameterizedTestSuiteInfo<simd_test_avx2::TestIntrinsic<std::tuple<unsigned_int,_unsigned_int,_const_char_*>_>_>
  *in_stack_ffffffffffffffc0;
  CodeLocation *in_stack_fffffffffffffff0;
  char *in_stack_fffffffffffffff8;
  
  iVar1 = (int)((ulong)in_stack_ffffffffffffff30 >> 0x20);
  testing::UnitTest::GetInstance();
  this = (CodeLocation *)testing::UnitTest::parameterized_test_registry((UnitTest *)0x6d0d34);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffffb8,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/simd_impl.h"
             ,(allocator *)&stack0xffffffffffffffb7);
  testing::internal::CodeLocation::CodeLocation(this,in_stack_ffffffffffffff38,iVar1);
  a_file = testing::internal::ParameterizedTestSuiteRegistry::
           GetTestSuitePatternHolder<simd_test_avx2::TestIntrinsic<std::tuple<unsigned_int,unsigned_int,char_const*>>>
                     (unaff_retaddr,in_stack_fffffffffffffff8,in_stack_fffffffffffffff0);
  this_00 = (TestMetaFactory<simd_test_avx2::V64_V256_avx2_TestIntrinsics_Test> *)operator_new(8);
  testing::internal::TestMetaFactory<simd_test_avx2::V64_V256_avx2_TestIntrinsics_Test>::
  TestMetaFactory(this_00);
  iVar1 = (int)((ulong)this_00 >> 0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_a8,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/simd_impl.h"
             ,&local_a9);
  testing::internal::CodeLocation::CodeLocation(this,(string *)a_file,iVar1);
  testing::internal::
  ParameterizedTestSuiteInfo<simd_test_avx2::TestIntrinsic<std::tuple<unsigned_int,_unsigned_int,_const_char_*>_>_>
  ::AddTestPattern(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                   in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  testing::internal::CodeLocation::~CodeLocation((CodeLocation *)0x6d0e28);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  testing::internal::CodeLocation::~CodeLocation((CodeLocation *)0x6d0e49);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffb7);
  return 0;
}

Assistant:

MY_TEST_P(ARCH_POSTFIX(V64_V256), TestIntrinsics) {
  TestSimd1Arg<c_v64, c_v256>(kIterations, mask, maskwidth, name);
}